

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_io.cpp
# Opt level: O2

string * __thiscall
(anonymous_namespace)::DestinationEncoder::operator()[abi_cxx11_
          (string *__return_storage_ptr__,void *this,WitnessUnknown *id)

{
  byte *pbVar1;
  byte *pbVar2;
  size_t bits;
  ulong uVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  initializer_list<unsigned_char> __l;
  allocator_type local_59;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  anon_class_8_1_898a9ca8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((id->m_version - 0x11 < 0xfffffff0) ||
     ((id->m_program).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish +
      (-0x29 - (long)(id->m_program).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start) < (pointer)0xffffffffffffffd9)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    local_40.data._0_1_ = (char)id->m_version;
    __l._M_len = 1;
    __l._M_array = (iterator)&local_40;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&data,__l,&local_59);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              (&data,(((long)(id->m_program).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(id->m_program).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start) * 8 + 4U) / 5 + 1);
    pbVar1 = (id->m_program).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    uVar3 = 0;
    uVar4 = 0;
    local_40.data = &data;
    for (pbVar2 = (id->m_program).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1) {
      uVar4 = (ulong)(((uint)uVar4 & 0xf) << 8) | (ulong)*pbVar2;
      uVar3 = uVar3 + 8;
      while (4 < uVar3) {
        uVar3 = uVar3 - 5;
        anon_unknown.dwarf_1dbd6c7::DestinationEncoder::operator()::anon_class_8_1_898a9ca8::
        operator()(&local_40,(byte)(uVar4 >> ((byte)uVar3 & 0x3f)) & 0x1f);
      }
    }
    if (uVar3 != 0) {
      anon_unknown.dwarf_1dbd6c7::DestinationEncoder::operator()::anon_class_8_1_898a9ca8::
      operator()(&local_40,(byte)((uint)uVar4 << (5U - (char)uVar3 & 0x1f)) & 0x1f);
    }
    bech32::Encode(__return_storage_ptr__,BECH32M,(string *)(*this + 0x220),&data);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string operator()(const WitnessUnknown& id) const
    {
        const std::vector<unsigned char>& program = id.GetWitnessProgram();
        if (id.GetWitnessVersion() < 1 || id.GetWitnessVersion() > 16 || program.size() < 2 || program.size() > 40) {
            return {};
        }
        std::vector<unsigned char> data = {(unsigned char)id.GetWitnessVersion()};
        data.reserve(1 + (program.size() * 8 + 4) / 5);
        ConvertBits<8, 5, true>([&](unsigned char c) { data.push_back(c); }, program.begin(), program.end());
        return bech32::Encode(bech32::Encoding::BECH32M, m_params.Bech32HRP(), data);
    }